

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_dsc.c
# Opt level: O2

int dwarf_discr_entry_u(Dwarf_Dsc_Head dsh,Dwarf_Unsigned entrynum,Dwarf_Half *out_type,
                       Dwarf_Unsigned *out_discr_low,Dwarf_Unsigned *out_discr_high,
                       Dwarf_Error *error)

{
  Dwarf_Dsc_Entry_s *pDVar1;
  int iVar2;
  size_t count;
  
  if (dsh->dsh_count <= entrynum) {
    return -1;
  }
  if (dsh->dsh_set_unsigned == 0) {
    count = dsh->dsh_count;
    iVar2 = get_dsc_leb_entries(dsh->dsh_debug,dsh->dsh_block,dsh->dsh_block_len,1,dsh->dsh_array,
                                &count,error);
    if (iVar2 != 0) {
      return iVar2;
    }
    dsh->dsh_set_unsigned = 1;
  }
  pDVar1 = dsh->dsh_array;
  if (pDVar1 == (Dwarf_Dsc_Entry_s *)0x0) {
    _dwarf_error(dsh->dsh_debug,error,0x161);
  }
  else {
    *out_type = pDVar1[entrynum].dsc_type;
    *out_discr_low = pDVar1[entrynum].dsc_low_u;
    *out_discr_high = pDVar1[entrynum].dsc_high_u;
  }
  return (uint)(pDVar1 == (Dwarf_Dsc_Entry_s *)0x0);
}

Assistant:

int
dwarf_discr_entry_u(Dwarf_Dsc_Head  dsh ,
    Dwarf_Unsigned   entrynum,
    Dwarf_Half     * out_type,
    Dwarf_Unsigned * out_discr_low,
    Dwarf_Unsigned * out_discr_high,
    Dwarf_Error    * error)
{
    struct Dwarf_Dsc_Entry_s *dse = 0;

    (void)error;
    if (entrynum >= dsh->dsh_count) {
        return DW_DLV_NO_ENTRY;
    }
    if (!dsh->dsh_set_unsigned) {
        int res =0;
        int dounsigned = 1;
        size_t count = dsh->dsh_count;

        res = get_dsc_leb_entries(dsh->dsh_debug,
            dsh->dsh_block,
            dsh->dsh_block_len,
            dounsigned,
            dsh->dsh_array,
            &count,
            error);
        if (res != DW_DLV_OK) {
            return res;
        }
        dsh->dsh_set_unsigned = TRUE;
    }
    if (!dsh->dsh_array) {
        _dwarf_error(dsh->dsh_debug, error, DW_DLE_DISCR_ARRAY_ERROR);
        return DW_DLV_ERROR;
    }
    dse = dsh->dsh_array + entrynum;
    *out_type       = dse->dsc_type;
    *out_discr_low  = dse->dsc_low_u;
    *out_discr_high = dse->dsc_high_u;
    return DW_DLV_OK;
}